

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  BYTE **ppBVar1;
  byte bVar2;
  undefined2 uVar3;
  BYTE *pBVar4;
  uint uVar5;
  BIT_DStream_status BVar6;
  BIT_DStream_status BVar7;
  BIT_DStream_status BVar8;
  BIT_DStream_status BVar9;
  int iVar10;
  size_t sVar11;
  BYTE *pBVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  undefined1 *puVar17;
  int iVar18;
  ulong srcSize;
  undefined1 *puVar19;
  int iVar20;
  long lVar21;
  ulong srcSize_00;
  void *pvVar22;
  uint uVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  bool bVar29;
  size_t sStack_1c0;
  BYTE *pStart;
  U64 bits [4];
  char *local_178;
  BYTE *ip [4];
  BYTE *local_148;
  undefined1 local_138 [8];
  BYTE *pBStack_130;
  size_t *local_128;
  size_t *psStack_120;
  size_t *local_118;
  undefined1 *local_108;
  size_t local_100;
  undefined1 *local_f8;
  int local_ec;
  undefined1 *local_e8;
  int local_dc;
  undefined1 *local_d8;
  undefined1 *local_d0;
  HUF_DecompressFastArgs args;
  
  local_100 = dstSize;
  if ((flags & 0x20U) == 0) {
    sVar11 = HUF_DecompressFastArgs_init(&args,dst,dstSize,cSrc,cSrcSize,DTable);
    if (sVar11 - 1 < 0xffffffffffffff88) {
      if (args.ip[0] < args.ilimit) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x329,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      pBVar24 = (BYTE *)((long)cSrc + 6);
      pBVar12 = (BYTE *)(local_100 + (long)dst);
      bits[0] = args.bits[0];
      bits[1] = args.bits[1];
      bits[2] = args.bits[2];
      bits[3] = args.bits[3];
      ip[0] = args.ip[0];
      ip[1] = args.ip[1];
      ip[2] = args.ip[2];
      ip[3] = args.ip[3];
      local_138 = (undefined1  [8])args.op[0];
      pBStack_130 = args.op[1];
      local_128 = (size_t *)args.op[2];
      psStack_120 = (size_t *)args.op[3];
      lVar21 = 0;
      while( true ) {
        while (lVar21 != 4) {
          pBVar25 = args.oend;
          if (lVar21 != 3) {
            pBVar25 = (&pBStack_130)[lVar21];
          }
          if (pBVar25 < *(BYTE **)(local_138 + lVar21 * 8)) {
            __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2c9,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          ppBVar1 = ip + lVar21;
          lVar21 = lVar21 + 1;
          if (*ppBVar1 < args.ilimit) {
            __assert_fail("ip[stream] >= ilimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2ca,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
        }
        uVar13 = (ulong)((long)args.oend - (long)psStack_120) / 5;
        uVar14 = (ulong)((long)ip[0] - (long)args.ilimit) / 7;
        if (uVar13 < uVar14) {
          uVar14 = uVar13;
        }
        if (((((long)(uVar14 * 5) < 0x14) || (ip[1] < ip[0])) || (ip[2] < ip[1])) || (ip[3] < ip[2])
           ) break;
        pBVar25 = (BYTE *)((long)psStack_120 + uVar14 * 5);
        lVar15 = 0;
        do {
          for (; lVar15 != 5; lVar15 = lVar15 + 1) {
            for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
              uVar3 = *(undefined2 *)((long)args.dt + (bits[lVar21] >> 0x35) * 2);
              bits[lVar21] = bits[lVar21] << ((byte)uVar3 & 0x3f);
              *(char *)(*(long *)(local_138 + lVar21 * 8) + lVar15) = (char)((ushort)uVar3 >> 8);
            }
          }
          for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
            uVar5 = ZSTD_countTrailingZeros64(bits[lVar21]);
            *(long *)(local_138 + lVar21 * 8) = *(long *)(local_138 + lVar21 * 8) + 5;
            pBVar4 = ip[lVar21];
            ip[lVar21] = pBVar4 + -(ulong)(uVar5 >> 3);
            bits[lVar21] = (*(ulong *)(pBVar4 + -(ulong)(uVar5 >> 3)) | 1) << ((byte)uVar5 & 7);
          }
          lVar21 = 0;
          lVar15 = 0;
        } while (psStack_120 < pBVar25);
      }
      args.bits[2] = bits[2];
      args.bits[3] = bits[3];
      args.bits[0] = bits[0];
      args.bits[1] = bits[1];
      args.ip[0] = ip[0];
      args.ip[1] = ip[1];
      args.ip[2] = ip[2];
      args.ip[3] = ip[3];
      args.op[2] = (BYTE *)local_128;
      args.op[3] = (BYTE *)psStack_120;
      args.op[0] = (BYTE *)local_138;
      args.op[1] = pBStack_130;
      if (ip[0] < pBVar24) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x32f,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (ip[1] < pBVar24) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x330,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (ip[2] < pBVar24) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x331,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (ip[3] < pBVar24) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x332,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (pBVar12 < psStack_120) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x333,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      uVar14 = local_100 + 3 >> 2;
      lVar21 = 0;
      do {
        if (lVar21 == 4) {
          if (local_100 != 0) {
            return local_100;
          }
          __assert_fail("dstSize != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                        ,0x348,
                        "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                       );
        }
        uVar13 = (long)pBVar12 - (long)dst;
        dst = (BYTE *)((long)dst + uVar14);
        if (uVar13 < uVar14) {
          dst = pBVar12;
        }
        sVar11 = HUF_initRemainingDStream((BIT_DStream_t *)bits,&args,(int)lVar21,(BYTE *)dst);
        if (0xffffffffffffff88 < sVar11) {
          return sVar11;
        }
        pBVar24 = args.op[lVar21];
        lVar15 = (long)dst - (long)pBVar24;
        if (lVar15 < 4) {
          if ((uint)bits[1] < 0x41) {
            if (bits[2] < local_178) {
              if (bits[2] != bits[3]) {
                uVar5 = (int)bits[2] - (int)bits[3];
                if (bits[3] <= bits[2] - ((uint)bits[1] >> 3)) {
                  uVar5 = (uint)bits[1] >> 3;
                }
                bits[2] = bits[2] - uVar5;
                bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + uVar5 * -8);
                bits[0] = *(U64 *)bits[2];
              }
            }
            else {
              BIT_reloadDStreamFast((BIT_DStream_t *)bits);
            }
          }
        }
        else {
          uVar5 = (uint)bits[1];
          while (uVar5 < 0x41) {
            if (bits[2] < local_178) {
              if (bits[2] == bits[3]) break;
              bVar29 = bits[2] - (uVar5 >> 3) < bits[3];
              uVar23 = (int)bits[2] - (int)bits[3];
              if (!bVar29) {
                uVar23 = uVar5 >> 3;
              }
              BVar9 = (BIT_DStream_status)bVar29;
              bits[2] = bits[2] - uVar23;
              bits[1] = CONCAT44(bits[1]._4_4_,uVar5 + uVar23 * -8);
              bits[0] = *(U64 *)bits[2];
            }
            else {
              BVar9 = BIT_reloadDStreamFast((BIT_DStream_t *)bits);
            }
            if (((BYTE *)((long)dst + -3) <= pBVar24) || (BVar9 != BIT_DStream_unfinished)) break;
            uVar13 = (bits[0] << ((byte)bits[1] & 0x3f)) >> 0x35;
            iVar10 = *(byte *)((long)DTable + uVar13 * 2 + 4) + (uint)bits[1];
            *pBVar24 = *(BYTE *)((long)DTable + uVar13 * 2 + 5);
            uVar13 = (bits[0] << ((byte)iVar10 & 0x3f)) >> 0x35;
            iVar10 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar10;
            pBVar24[1] = *(BYTE *)((long)DTable + uVar13 * 2 + 5);
            uVar13 = (bits[0] << ((byte)iVar10 & 0x3f)) >> 0x35;
            iVar10 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar10;
            pBVar24[2] = *(BYTE *)((long)DTable + uVar13 * 2 + 5);
            uVar13 = (bits[0] << ((byte)iVar10 & 0x3f)) >> 0x35;
            uVar5 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar10;
            bits[1] = CONCAT44(bits[1]._4_4_,uVar5);
            pBVar24[3] = *(BYTE *)((long)DTable + uVar13 * 2 + 5);
            pBVar24 = pBVar24 + 4;
          }
        }
        for (; pBVar24 < dst; pBVar24 = pBVar24 + 1) {
          uVar13 = (bits[0] << ((byte)bits[1] & 0x3f)) >> 0x35;
          bits[1] = CONCAT44(bits[1]._4_4_,*(byte *)((long)DTable + uVar13 * 2 + 4) + (uint)bits[1])
          ;
          *pBVar24 = *(BYTE *)((long)DTable + uVar13 * 2 + 5);
        }
        pBVar24 = args.op[lVar21];
        args.op[lVar21] = pBVar24 + lVar15;
        lVar21 = lVar21 + 1;
        if (pBVar24 + lVar15 != (BYTE *)dst) {
          return 0xffffffffffffffec;
        }
      } while( true );
    }
    if (sVar11 != 0) {
      return sVar11;
    }
  }
  if (cSrcSize < 10) {
    sStack_1c0 = 0xffffffffffffffec;
  }
  else {
    srcSize_00 = (ulong)*cSrc;
    srcSize = (ulong)*(ushort *)((long)cSrc + 2);
    uVar13 = (ulong)*(ushort *)((long)cSrc + 4);
    uVar14 = srcSize_00 + srcSize + uVar13 + 6;
    sStack_1c0 = 0xffffffffffffffec;
    if ((5 < local_100) && (uVar14 <= cSrcSize)) {
      local_d8 = (undefined1 *)((long)dst + local_100);
      uVar16 = local_100 + 3 >> 2;
      puVar28 = (undefined1 *)((long)dst + uVar16);
      local_108 = puVar28 + uVar16;
      local_f8 = local_108 + uVar16;
      if (local_f8 <= local_d8) {
        uVar5 = (uint)*(byte *)((long)DTable + 2);
        sStack_1c0 = BIT_initDStream((BIT_DStream_t *)&args,(void *)((long)cSrc + 6),srcSize_00);
        if (sStack_1c0 < 0xffffffffffffff89) {
          pvVar22 = (void *)((long)cSrc + srcSize_00 + 6);
          sStack_1c0 = BIT_initDStream((BIT_DStream_t *)bits,pvVar22,srcSize);
          if (sStack_1c0 < 0xffffffffffffff89) {
            pvVar22 = (void *)((long)pvVar22 + srcSize);
            sStack_1c0 = BIT_initDStream((BIT_DStream_t *)ip,pvVar22,uVar13);
            if ((sStack_1c0 < 0xffffffffffffff89) &&
               (sStack_1c0 = BIT_initDStream((BIT_DStream_t *)local_138,
                                             (void *)((long)pvVar22 + uVar13),cSrcSize - uVar14),
               sStack_1c0 < 0xffffffffffffff89)) {
              local_d0 = (undefined1 *)((long)dst + (local_100 - 3));
              puVar17 = puVar28;
              puVar19 = local_f8;
              puVar26 = local_108;
              if (7 < (ulong)((long)local_d8 - (long)local_f8)) {
                lVar21 = uVar16 * 3;
                bVar29 = true;
                while (((undefined1 *)((long)dst + lVar21) < local_d0 && (bVar29))) {
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar5);
                  iVar18 = *(byte *)((long)DTable + sVar11 * 2 + 4) + (uint)args.ip[1];
                  args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,iVar18);
                  *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar5);
                  iVar10 = *(byte *)((long)DTable + sVar11 * 2 + 4) + (uint)bits[1];
                  bits[1] = CONCAT44(bits[1]._4_4_,iVar10);
                  *(undefined1 *)((long)dst + uVar16) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar5);
                  iVar20 = *(byte *)((long)DTable + sVar11 * 2 + 4) + (uint)ip[1];
                  ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,iVar20);
                  *(undefined1 *)((long)dst + uVar16 * 2) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)local_138,uVar5);
                  uVar23 = *(byte *)((long)DTable + sVar11 * 2 + 4) + (uint)pBStack_130;
                  *(undefined1 *)((long)dst + lVar21) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  pBStack_130._0_4_ = uVar23;
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar5);
                  local_ec = (uint)*(byte *)((long)DTable + sVar11 * 2 + 4) + iVar18;
                  args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,local_ec);
                  *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar5);
                  iVar10 = (uint)*(byte *)((long)DTable + sVar11 * 2 + 4) + iVar10;
                  local_e8 = (undefined1 *)CONCAT44(local_e8._4_4_,iVar10);
                  bits[1] = CONCAT44(bits[1]._4_4_,iVar10);
                  *(undefined1 *)((long)dst + uVar16 + 1) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar5);
                  iVar20 = (uint)*(byte *)((long)DTable + sVar11 * 2 + 4) + iVar20;
                  ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,iVar20);
                  *(undefined1 *)((long)dst + uVar16 * 2 + 1) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)local_138,uVar5);
                  uVar23 = *(byte *)((long)DTable + sVar11 * 2 + 4) + uVar23;
                  *(undefined1 *)((long)dst + lVar21 + 1) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  pBStack_130._0_4_ = uVar23;
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar5);
                  iVar10 = (uint)*(byte *)((long)DTable + sVar11 * 2 + 4) + local_ec;
                  args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,iVar10);
                  *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar5);
                  local_ec = (uint)*(byte *)((long)DTable + sVar11 * 2 + 4) + (int)local_e8;
                  bits[1] = CONCAT44(bits[1]._4_4_,local_ec);
                  *(undefined1 *)((long)dst + uVar16 + 2) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar5);
                  local_dc = (uint)*(byte *)((long)DTable + sVar11 * 2 + 4) + iVar20;
                  ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,local_dc);
                  *(undefined1 *)((long)dst + uVar16 * 2 + 2) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)local_138,uVar5);
                  uVar23 = *(byte *)((long)DTable + sVar11 * 2 + 4) + uVar23;
                  *(undefined1 *)((long)dst + lVar21 + 2) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  pBStack_130._0_4_ = uVar23;
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar5);
                  args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                                (uint)*(byte *)((long)DTable + sVar11 * 2 + 4) +
                                                iVar10);
                  local_e8 = (undefined1 *)((long)dst + 4);
                  *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar5);
                  bits[1] = CONCAT44(bits[1]._4_4_,
                                     (uint)*(byte *)((long)DTable + sVar11 * 2 + 4) + local_ec);
                  *(undefined1 *)((long)dst + uVar16 + 3) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar5);
                  ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,
                                           (uint)*(byte *)((long)DTable + sVar11 * 2 + 4) + local_dc
                                          );
                  *(undefined1 *)((long)dst + uVar16 * 2 + 3) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)local_138,uVar5);
                  pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                 *(byte *)((long)DTable + sVar11 * 2 + 4) + uVar23);
                  *(undefined1 *)((long)dst + lVar21 + 3) =
                       *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  BVar9 = BIT_reloadDStreamFast((BIT_DStream_t *)&args);
                  BVar6 = BIT_reloadDStreamFast((BIT_DStream_t *)bits);
                  BVar7 = BIT_reloadDStreamFast((BIT_DStream_t *)ip);
                  BVar8 = BIT_reloadDStreamFast((BIT_DStream_t *)local_138);
                  bVar29 = BVar8 == BIT_DStream_unfinished &&
                           (BVar7 == BIT_DStream_unfinished &&
                           (BVar6 == BIT_DStream_unfinished && BVar9 == BIT_DStream_unfinished));
                  dst = local_e8;
                }
                puVar17 = (undefined1 *)((long)dst + uVar16);
                puVar19 = (undefined1 *)((long)dst + lVar21);
                puVar26 = (undefined1 *)((long)dst + uVar16 * 2);
              }
              sStack_1c0 = 0xffffffffffffffec;
              if (puVar26 <= local_f8 && (puVar17 <= local_108 && dst <= puVar28)) {
                if ((long)puVar28 - (long)dst < 4) {
                  if ((uint)args.ip[1] < 0x41) {
                    if (args.ip[2] < args.op[0]) {
                      if (args.ip[2] != args.ip[3]) {
                        uVar23 = (int)args.ip[2] - (int)args.ip[3];
                        if (args.ip[3] <= args.ip[2] + -(ulong)((uint)args.ip[1] >> 3)) {
                          uVar23 = (uint)args.ip[1] >> 3;
                        }
                        args.ip[2] = args.ip[2] + -(ulong)uVar23;
                        args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                                      (uint)args.ip[1] + uVar23 * -8);
                        args.ip[0] = *(BYTE **)args.ip[2];
                      }
                    }
                    else {
                      BIT_reloadDStreamFast((BIT_DStream_t *)&args);
                    }
                  }
                }
                else {
                  while ((uint)args.ip[1] < 0x41) {
                    if (args.ip[2] < args.op[0]) {
                      if (args.ip[2] == args.ip[3]) break;
                      uVar23 = (int)args.ip[2] - (int)args.ip[3];
                      if (args.ip[2] + -(ulong)((uint)args.ip[1] >> 3) >= args.ip[3]) {
                        uVar23 = (uint)args.ip[1] >> 3;
                      }
                      BVar9 = (BIT_DStream_status)
                              (args.ip[2] + -(ulong)((uint)args.ip[1] >> 3) < args.ip[3]);
                      args.ip[2] = args.ip[2] + -(ulong)uVar23;
                      args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,(uint)args.ip[1] + uVar23 * -8)
                      ;
                      args.ip[0] = *(BYTE **)args.ip[2];
                    }
                    else {
                      BVar9 = BIT_reloadDStreamFast((BIT_DStream_t *)&args);
                    }
                    if ((puVar28 + -3 <= dst) || (BVar9 != BIT_DStream_unfinished)) break;
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar5);
                    args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                                  (uint)args.ip[1] +
                                                  *(byte *)((long)DTable + sVar11 * 2 + 4));
                    *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar5);
                    args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                                  (uint)args.ip[1] +
                                                  *(byte *)((long)DTable + sVar11 * 2 + 4));
                    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar5);
                    args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                                  (uint)args.ip[1] +
                                                  *(byte *)((long)DTable + sVar11 * 2 + 4));
                    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar5);
                    args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                                  (uint)args.ip[1] +
                                                  *(byte *)((long)DTable + sVar11 * 2 + 4));
                    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    dst = (void *)((long)dst + 4);
                  }
                }
                for (; puVar27 = local_108, dst < puVar28; dst = (void *)((long)dst + 1)) {
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)&args,uVar5);
                  args.ip[1] = (BYTE *)CONCAT44(args.ip[1]._4_4_,
                                                (uint)args.ip[1] +
                                                *(byte *)((long)DTable + sVar11 * 2 + 4));
                  *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                }
                if ((long)local_108 - (long)puVar17 < 4) {
                  if ((uint)bits[1] < 0x41) {
                    if (bits[2] < local_178) {
                      if (bits[2] != bits[3]) {
                        uVar23 = (int)bits[2] - (int)bits[3];
                        if (bits[3] <= bits[2] - ((uint)bits[1] >> 3)) {
                          uVar23 = (uint)bits[1] >> 3;
                        }
                        bits[2] = bits[2] - uVar23;
                        bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + uVar23 * -8);
                        bits[0] = *(U64 *)bits[2];
                      }
                    }
                    else {
                      BIT_reloadDStreamFast((BIT_DStream_t *)bits);
                    }
                  }
                }
                else {
                  puVar28 = local_108 + -3;
                  while (puVar27 = local_108, (uint)bits[1] < 0x41) {
                    if (bits[2] < local_178) {
                      if (bits[2] == bits[3]) break;
                      bVar29 = bits[2] - ((uint)bits[1] >> 3) < bits[3];
                      uVar23 = (int)bits[2] - (int)bits[3];
                      if (!bVar29) {
                        uVar23 = (uint)bits[1] >> 3;
                      }
                      BVar9 = (BIT_DStream_status)bVar29;
                      bits[2] = bits[2] - uVar23;
                      bits[1] = CONCAT44(bits[1]._4_4_,(uint)bits[1] + uVar23 * -8);
                      bits[0] = *(U64 *)bits[2];
                    }
                    else {
                      BVar9 = BIT_reloadDStreamFast((BIT_DStream_t *)bits);
                    }
                    puVar27 = local_108;
                    if ((puVar28 <= puVar17) || (BVar9 != BIT_DStream_unfinished)) break;
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar5);
                    bits[1] = CONCAT44(bits[1]._4_4_,
                                       (uint)bits[1] + *(byte *)((long)DTable + sVar11 * 2 + 4));
                    *puVar17 = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar5);
                    bits[1] = CONCAT44(bits[1]._4_4_,
                                       (uint)bits[1] + *(byte *)((long)DTable + sVar11 * 2 + 4));
                    puVar17[1] = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar5);
                    bits[1] = CONCAT44(bits[1]._4_4_,
                                       (uint)bits[1] + *(byte *)((long)DTable + sVar11 * 2 + 4));
                    puVar17[2] = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar5);
                    bits[1] = CONCAT44(bits[1]._4_4_,
                                       (uint)bits[1] + *(byte *)((long)DTable + sVar11 * 2 + 4));
                    puVar17[3] = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    puVar17 = puVar17 + 4;
                  }
                }
                for (; puVar28 = local_f8, puVar17 < puVar27; puVar17 = puVar17 + 1) {
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)bits,uVar5);
                  bits[1] = CONCAT44(bits[1]._4_4_,
                                     (uint)bits[1] + *(byte *)((long)DTable + sVar11 * 2 + 4));
                  *puVar17 = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                  puVar27 = local_108;
                }
                if ((long)local_f8 - (long)puVar26 < 4) {
                  if ((uint)ip[1] < 0x41) {
                    if (ip[2] < local_148) {
                      if (ip[2] != ip[3]) {
                        uVar23 = (int)ip[2] - (int)ip[3];
                        if (ip[3] <= ip[2] + -(ulong)((uint)ip[1] >> 3)) {
                          uVar23 = (uint)ip[1] >> 3;
                        }
                        ip[2] = ip[2] + -(ulong)uVar23;
                        ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + uVar23 * -8);
                        ip[0] = *(BYTE **)ip[2];
                      }
                    }
                    else {
                      BIT_reloadDStreamFast((BIT_DStream_t *)ip);
                    }
                  }
                }
                else {
                  puVar17 = local_f8 + -3;
                  while (puVar28 = local_f8, (uint)ip[1] < 0x41) {
                    if (ip[2] < local_148) {
                      if (ip[2] == ip[3]) break;
                      uVar23 = (int)ip[2] - (int)ip[3];
                      if (ip[2] + -(ulong)((uint)ip[1] >> 3) >= ip[3]) {
                        uVar23 = (uint)ip[1] >> 3;
                      }
                      BVar9 = (BIT_DStream_status)(ip[2] + -(ulong)((uint)ip[1] >> 3) < ip[3]);
                      ip[2] = ip[2] + -(ulong)uVar23;
                      ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,(uint)ip[1] + uVar23 * -8);
                      ip[0] = *(BYTE **)ip[2];
                    }
                    else {
                      BVar9 = BIT_reloadDStreamFast((BIT_DStream_t *)ip);
                    }
                    puVar28 = local_f8;
                    if ((puVar17 <= puVar26) || (BVar9 != BIT_DStream_unfinished)) break;
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar5);
                    ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,
                                             (uint)ip[1] + *(byte *)((long)DTable + sVar11 * 2 + 4))
                    ;
                    *puVar26 = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar5);
                    ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,
                                             (uint)ip[1] + *(byte *)((long)DTable + sVar11 * 2 + 4))
                    ;
                    puVar26[1] = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar5);
                    ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,
                                             (uint)ip[1] + *(byte *)((long)DTable + sVar11 * 2 + 4))
                    ;
                    puVar26[2] = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar5);
                    ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,
                                             (uint)ip[1] + *(byte *)((long)DTable + sVar11 * 2 + 4))
                    ;
                    puVar26[3] = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    puVar26 = puVar26 + 4;
                  }
                }
                for (; puVar17 = local_d8, puVar26 < puVar28; puVar26 = puVar26 + 1) {
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)ip,uVar5);
                  ip[1] = (BYTE *)CONCAT44(ip[1]._4_4_,
                                           (uint)ip[1] + *(byte *)((long)DTable + sVar11 * 2 + 4));
                  *puVar26 = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                }
                if ((long)local_d8 - (long)puVar19 < 4) {
                  if ((uint)pBStack_130 < 0x41) {
                    if (local_128 < local_118) {
                      if (local_128 != psStack_120) {
                        uVar23 = (int)local_128 - (int)psStack_120;
                        if (psStack_120 <=
                            (size_t *)((long)local_128 - (ulong)((uint)pBStack_130 >> 3))) {
                          uVar23 = (uint)pBStack_130 >> 3;
                        }
                        local_128 = (size_t *)((long)local_128 - (ulong)uVar23);
                        pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                       (uint)pBStack_130 + uVar23 * -8);
                        local_138 = (undefined1  [8])*local_128;
                      }
                    }
                    else {
                      BIT_reloadDStreamFast((BIT_DStream_t *)local_138);
                    }
                  }
                }
                else {
                  while ((uint)pBStack_130 < 0x41) {
                    if (local_128 < local_118) {
                      if (local_128 == psStack_120) break;
                      bVar29 = (size_t *)((long)local_128 - (ulong)((uint)pBStack_130 >> 3)) <
                               psStack_120;
                      uVar23 = (int)local_128 - (int)psStack_120;
                      if (!bVar29) {
                        uVar23 = (uint)pBStack_130 >> 3;
                      }
                      BVar9 = (BIT_DStream_status)bVar29;
                      local_128 = (size_t *)((long)local_128 - (ulong)uVar23);
                      pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                     (uint)pBStack_130 + uVar23 * -8);
                      local_138 = (undefined1  [8])*local_128;
                    }
                    else {
                      BVar9 = BIT_reloadDStreamFast((BIT_DStream_t *)local_138);
                    }
                    if ((local_d0 <= puVar19) || (BVar9 != BIT_DStream_unfinished)) break;
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)local_138,uVar5);
                    bVar2 = *(byte *)((long)DTable + sVar11 * 2 + 4);
                    *puVar19 = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    pBStack_130._0_4_ = (uint)pBStack_130 + bVar2;
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)local_138,uVar5);
                    pBStack_130._0_4_ = (uint)pBStack_130 + *(byte *)((long)DTable + sVar11 * 2 + 4)
                    ;
                    puVar19[1] = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)local_138,uVar5);
                    pBStack_130._0_4_ = (uint)pBStack_130 + *(byte *)((long)DTable + sVar11 * 2 + 4)
                    ;
                    puVar19[2] = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    sVar11 = BIT_lookBitsFast((BIT_DStream_t *)local_138,uVar5);
                    pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                   (uint)pBStack_130 +
                                                   *(byte *)((long)DTable + sVar11 * 2 + 4));
                    puVar19[3] = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                    puVar19 = puVar19 + 4;
                  }
                }
                for (; puVar19 < puVar17; puVar19 = puVar19 + 1) {
                  sVar11 = BIT_lookBitsFast((BIT_DStream_t *)local_138,uVar5);
                  pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                 (uint)pBStack_130 +
                                                 *(byte *)((long)DTable + sVar11 * 2 + 4));
                  *puVar19 = *(undefined1 *)((long)DTable + sVar11 * 2 + 5);
                }
                sVar11 = 0xffffffffffffffec;
                if ((uint)pBStack_130 != 0x40) {
                  local_100 = sVar11;
                }
                if (local_128 != psStack_120) {
                  local_100 = sVar11;
                }
                if ((uint)ip[1] != 0x40) {
                  local_100 = sVar11;
                }
                if (ip[2] != ip[3]) {
                  local_100 = sVar11;
                }
                if ((uint)bits[1] != 0x40) {
                  local_100 = sVar11;
                }
                if (bits[2] != bits[3]) {
                  local_100 = sVar11;
                }
                if ((uint)args.ip[1] != 0x40) {
                  local_100 = sVar11;
                }
                sStack_1c0 = local_100;
                if (args.ip[2] != args.ip[3]) {
                  sStack_1c0 = sVar11;
                }
              }
            }
          }
        }
      }
    }
  }
  return sStack_1c0;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}